

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmArray(LlvmCompilationContext *ctx,ExprArray *node)

{
  LLVMBuilderRef pLVar1;
  LLVMValueRef value_00;
  LLVMTypeRef pLVar2;
  LLVMValueRef pLVar3;
  LLVMValueRef pLVar4;
  TypeBase *valueType;
  LLVMValueRef result;
  LLVMValueRef address;
  LLVMValueRef indices [2];
  LLVMValueRef element;
  ExprBase *value;
  uint i;
  LLVMValueRef storage;
  ExprArray *node_local;
  LlvmCompilationContext *ctx_local;
  
  pLVar1 = ctx->builder;
  pLVar2 = CompileLlvmType(ctx,(node->super_ExprBase).type);
  pLVar3 = LLVMBuildAlloca(pLVar1,pLVar2,"arr_lit");
  value._4_4_ = 0;
  for (element = (LLVMValueRef)(node->values).head; element != (LLVMValueRef)0x0;
      element = *(LLVMValueRef *)(element + 0x20)) {
    indices[1] = CompileLlvm(ctx,(ExprBase *)element);
    pLVar2 = LLVMInt32TypeInContext(ctx->context);
    address = LLVMConstInt(pLVar2,0,true);
    pLVar2 = LLVMInt32TypeInContext(ctx->context);
    indices[0] = LLVMConstInt(pLVar2,(ulong)value._4_4_,true);
    pLVar4 = LLVMBuildGEP(ctx->builder,pLVar3,&address,2,"");
    value_00 = indices[1];
    valueType = GetStackType(ctx,*(TypeBase **)(element + 0x18));
    indices[1] = ConvertToDataType(ctx,value_00,valueType,*(TypeBase **)(element + 0x18));
    LLVMBuildStore(ctx->builder,indices[1],pLVar4);
    value._4_4_ = value._4_4_ + 1;
  }
  pLVar3 = LLVMBuildLoad(ctx->builder,pLVar3,"");
  pLVar3 = CheckType(ctx,&node->super_ExprBase,pLVar3);
  return pLVar3;
}

Assistant:

LLVMValueRef CompileLlvmArray(LlvmCompilationContext &ctx, ExprArray *node)
{
	LLVMValueRef storage = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, node->type), "arr_lit");

	unsigned i = 0;

	for(ExprBase *value = node->values.head; value; value = value->next)
	{
		LLVMValueRef element = CompileLlvm(ctx, value);

		LLVMValueRef indices[] = { LLVMConstInt(LLVMInt32TypeInContext(ctx.context), 0, true), LLVMConstInt(LLVMInt32TypeInContext(ctx.context), i, true) };

		LLVMValueRef address = LLVMBuildGEP(ctx.builder, storage, indices, 2, "");

		element = ConvertToDataType(ctx, element, GetStackType(ctx, value->type), value->type);

		LLVMBuildStore(ctx.builder, element, address);

		i++;
	}

	LLVMValueRef result = LLVMBuildLoad(ctx.builder, storage, "");

	return CheckType(ctx, node, result);
}